

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string * __thiscall
sentencepiece::util::StrError_abi_cxx11_(string *__return_storage_ptr__,util *this,int errnum)

{
  char *__s;
  size_t sVar1;
  ostringstream os;
  char buffer [1024];
  undefined1 auStack_598 [8];
  long local_590 [14];
  ios_base local_520 [264];
  char local_418 [1024];
  
  __s = strerror_r((int)this,local_418,0x3ff);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_598 + (int)*(undefined8 *)(local_590[0] + -0x18) + 8);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590," Error #",8);
  std::ostream::operator<<(local_590,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  return __return_storage_ptr__;
}

Assistant:

std::string StrError(int errnum) {
  constexpr int kStrErrorSize = 1024;
  char buffer[kStrErrorSize];
  char *str = nullptr;
#if defined(__GLIBC__) && defined(_GNU_SOURCE)
  str = strerror_r(errnum, buffer, kStrErrorSize - 1);
#elif defined(_WIN32)
  strerror_s(buffer, kStrErrorSize - 1, errnum);
  str = buffer;
#else
  strerror_r(errnum, buffer, kStrErrorSize - 1);
  str = buffer;
#endif
  std::ostringstream os;
  os << str << " Error #" << errnum;
  return os.str();
}